

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O0

void burstsort2_bagwell(uchar **strings,size_t n)

{
  TrieNode<unsigned_char,_vector_bagwell<unsigned_char_*,_16U>_> *this;
  TrieNode<unsigned_char,_vector_bagwell<unsigned_char_*,_16U>_> *root;
  size_t n_local;
  uchar **strings_local;
  
  this = (TrieNode<unsigned_char,_vector_bagwell<unsigned_char_*,_16U>_> *)operator_new(0x18);
  TrieNode<unsigned_char,_vector_bagwell<unsigned_char_*,_16U>_>::TrieNode(this);
  insert<16384u,vector_bagwell<unsigned_char*,16u>,BurstSimple<unsigned_char>,unsigned_char>
            (this,strings,n);
  traverse<void(*)(unsigned_char**,int,int),vector_bagwell<unsigned_char*,16u>,unsigned_char>
            (this,strings,0,mkqsort);
  return;
}

Assistant:

void burstsort2_bagwell(unsigned char** strings, size_t n)
{
	typedef unsigned char CharT;
	typedef vector_bagwell<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = new TrieNode<CharT, BucketT>;
	insert<16384, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}